

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaiser_window.cc
# Opt level: O2

double anon_unknown.dwarf_2e002::I0(double x,int upper_limit,double eps)

{
  int i;
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  iVar1 = 1;
  dVar3 = 1.0;
  dVar4 = 1.0;
  do {
    if (iVar1 == 500) {
      return dVar4;
    }
    dVar3 = dVar3 * ((x * 0.5) / (double)iVar1);
    dVar2 = dVar3 * dVar3 + dVar4;
    dVar5 = dVar2 - dVar4;
    iVar1 = iVar1 + 1;
    dVar4 = dVar2;
  } while (1e-06 <= dVar5);
  return dVar2;
}

Assistant:

double I0(double x, int upper_limit = 500, double eps = 1e-6) {
  const double y(0.5 * x);
  double z(1.0);
  double sum(1.0);
  double prev_sum(sum);
  for (int i(1); i < upper_limit; ++i) {
    z *= y / i;
    sum += z * z;
    if (sum - prev_sum < eps) break;
    prev_sum = sum;
  }
  return sum;
}